

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

void des_store_lr(void *vp,LR lr)

{
  *(ushort *)((long)vp + 2) = (ushort)lr.L << 8 | (ushort)lr.L >> 8;
  *(char *)((long)vp + 1) = lr.L._2_1_;
  *(char *)vp = lr.L._3_1_;
  *(char *)((long)vp + 7) = (char)lr.R;
  *(char *)((long)vp + 6) = lr.R._1_1_;
  *(char *)((long)vp + 5) = lr.R._2_1_;
  *(char *)((long)vp + 4) = lr.R._3_1_;
  return;
}

Assistant:

static inline void des_store_lr(void *vp, LR lr)
{
    uint8_t *p = (uint8_t *)vp;
    PUT_32BIT_MSB_FIRST(p, lr.L);
    PUT_32BIT_MSB_FIRST(p+4, lr.R);
}